

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O0

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::add(map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      *this,domain *d,range *r)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  void *in_RDX;
  void *in_RSI;
  char *pcVar5;
  void *in_RDI;
  ostringstream dlib_o_out;
  unsigned_long *in_stack_fffffffffffffd78;
  map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffd80;
  error_type t;
  ostream local_190;
  void *local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::is_in_domain(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  if ((!bVar1) && (local_10 != local_18)) {
    map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::add(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
          (unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)0x3c7409);
    return;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar2 = std::operator<<(&local_190,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x73);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<(&local_190,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/bsp/../sockets/../threads/../map/map_kernel_c.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<(&local_190,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::map_kernel_c<dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>>::add(domain &, range &) [map_base = dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<(&local_190,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,
                           "(!this->is_in_domain(d)) && (static_cast<void*>(&d) != static_cast<void*>(&r))"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(&local_190,std::boolalpha);
  poVar2 = std::operator<<(poVar2,"\tvoid map::add");
  poVar2 = std::operator<<(poVar2,"\n\tdomain element being added must not already be in the map");
  poVar2 = std::operator<<(poVar2,"\n\tand d and r must not be the same variable");
  poVar2 = std::operator<<(poVar2,"\n\tis_in_domain(d): ");
  bVar1 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::is_in_domain(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  poVar2 = std::operator<<(poVar2,pcVar5);
  poVar2 = std::operator<<(poVar2,"\n\tthis: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI);
  poVar3 = std::operator<<(poVar2,"\n\t&d:   ");
  a = (string *)std::ostream::operator<<(poVar3,local_10);
  t = (error_type)((ulong)poVar3 >> 0x20);
  poVar3 = std::operator<<((ostream *)a,"\n\t&r:   ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
  std::operator<<(poVar3,"\n");
  uVar4 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar2,t,a);
  __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void map_kernel_c<map_base>::
    add (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (!this->is_in_domain(d)) &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::add"
            << "\n\tdomain element being added must not already be in the map"
            << "\n\tand d and r must not be the same variable"
            << "\n\tis_in_domain(d): " << (this->is_in_domain(d) ? "true" : "false")
            << "\n\tthis: " << this
            << "\n\t&d:   " << static_cast<void*>(&d)
            << "\n\t&r:   " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::add(d,r);
    }